

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O1

SQInteger thread_call(HSQUIRRELVM v)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQObjectType SVar3;
  SQTable *pSVar4;
  SQObjectPtr *pSVar5;
  SQInteger params;
  SQRESULT SVar6;
  long idx;
  bool bVar7;
  SQObjectPtr o;
  SQObjectPtr local_30;
  
  pSVar5 = SQVM::GetAt(v,v->_stackbase);
  local_30.super_SQObject._type = (pSVar5->super_SQObject)._type;
  local_30.super_SQObject._unVal = (SQObjectValue)(pSVar5->super_SQObject)._unVal.pThread;
  if ((local_30.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_30.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if (local_30.super_SQObject._type == OT_THREAD) {
    params = sq_gettop(v);
    SQVM::Push(local_30.super_SQObject._unVal.pThread,
               &(local_30.super_SQObject._unVal.pThread)->_roottable);
    if (1 < params) {
      idx = 2;
      do {
        sq_move((HSQUIRRELVM)local_30.super_SQObject._unVal.pTable,v,idx);
        bVar7 = idx != params;
        idx = idx + 1;
      } while (bVar7);
    }
    SVar6 = sq_call((HSQUIRRELVM)local_30.super_SQObject._unVal.pTable,params,1,1);
    if (SVar6 < 0) {
      SVar2 = (v->_lasterror).super_SQObject._type;
      pSVar4 = (v->_lasterror).super_SQObject._unVal.pTable;
      (v->_lasterror).super_SQObject._unVal =
           *(SQObjectValue *)&((local_30.super_SQObject._unVal.pGenerator)->_ci)._generator;
      SVar3 = ((local_30.super_SQObject._unVal.pNativeClosure)->_name).super_SQObject._type;
      (v->_lasterror).super_SQObject._type = SVar3;
      if ((SVar3 >> 0x1b & 1) != 0) {
        pSVar1 = &(((v->_lasterror).super_SQObject._unVal.pTable)->super_SQDelegable).
                  super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 + 1;
      }
      SVar6 = -1;
      if ((SVar2 >> 0x1b & 1) != 0) {
        pSVar1 = &(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
        *pSVar1 = *pSVar1 - 1;
        if (*pSVar1 == 0) {
          (*(pSVar4->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2]
          )();
        }
      }
    }
    else {
      sq_move(v,(HSQUIRRELVM)local_30.super_SQObject._unVal.pTable,-1);
      SVar6 = 1;
      sq_pop((HSQUIRRELVM)local_30.super_SQObject._unVal.pTable,1);
    }
  }
  else {
    SVar6 = sq_throwerror(v,"wrong parameter");
  }
  SQObjectPtr::~SQObjectPtr(&local_30);
  return SVar6;
}

Assistant:

static SQInteger thread_call(HSQUIRRELVM v)
{
    SQObjectPtr o = stack_get(v,1);
    if(sq_type(o) == OT_THREAD) {
        SQInteger nparams = sq_gettop(v);
        _thread(o)->Push(_thread(o)->_roottable);
        for(SQInteger i = 2; i<(nparams+1); i++)
            sq_move(_thread(o),v,i);
        if(SQ_SUCCEEDED(sq_call(_thread(o),nparams,SQTrue,SQTrue))) {
            sq_move(v,_thread(o),-1);
            sq_pop(_thread(o),1);
            return 1;
        }
        v->_lasterror = _thread(o)->_lasterror;
        return SQ_ERROR;
    }
    return sq_throwerror(v,_SC("wrong parameter"));
}